

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O2

void Eigen::internal::
     product_coeff_impl<0,_-1,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_double>
     ::run(Index row,Index col,Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *lhs,
          Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false> *rhs,
          double *res)

{
  Scalar SVar1;
  Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false>
  local_1c8;
  PointerType local_180 [2];
  long local_170;
  PointerType pdStack_168;
  long local_158;
  Nested local_150;
  Index IStack_148;
  Index local_140;
  MatrixBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>_>
  local_138 [96];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>_>
  local_d8;
  
  Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_1,_-1,_false>::Block
            (&local_1c8,lhs,row);
  local_180[0] = local_1c8.
                 super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false>,_0>
                 .m_data;
  local_170 = local_1c8.
              super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false>,_0>
              .m_cols.m_value;
  pdStack_168 = local_1c8.
                super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.
                m_data;
  local_158 = local_1c8.
              super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
              .m_xpr.
              super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.
              m_cols.m_value;
  local_150 = local_1c8.
              super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
              .m_xpr.
              super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.m_xpr;
  IStack_148 = local_1c8.
               super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
               m_outerStride;
  local_140 = local_1c8.
              super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false,_true>
              .m_outerStride;
  Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_-1,_1,_true>
  ::Block((Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>
           *)local_138,rhs,col);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>const,1,-1,false>const>>
  ::
  cwiseProduct<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const,_1,1,true>>
            (&local_d8,local_180,local_138);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_-1,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,__1,_1,_true>_>_>
                 *)&local_d8);
  *res = SVar1;
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Index row, Index col, const Lhs& lhs, const Rhs& rhs, RetScalar& res)
  {
    res = (lhs.row(row).transpose().cwiseProduct( rhs.col(col) )).sum();
  }